

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mssbcbs.c
# Opt level: O2

char * saslmssbcbs_get_mechanism_name(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism)

{
  char *pcVar1;
  
  pcVar1 = "MSSBCBS";
  if (sasl_mechanism == (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char* saslmssbcbs_get_mechanism_name(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism)
{
    const char* result;

    if (sasl_mechanism == NULL)
    {
        result = NULL;
    }
    else
    {
        result = "MSSBCBS";
    }

    return result;
}